

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactPdbTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactPdbTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  size_type *config;
  bool bVar1;
  TargetType TVar2;
  string pdbSupportVar;
  string language;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)this);
  if (bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_50,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string
              ((string *)&local_70,"TARGET_PDB_FILE not allowed for IMPORTED targets.",
               (allocator *)&local_b0);
    reportError((cmGeneratorExpressionContext *)target,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  config = &(target->ExportMacro)._M_string_length;
  cmGeneratorTarget::GetLinkerLanguage(&local_50,(cmGeneratorTarget *)this,(string *)config);
  std::operator+(&local_b0,"CMAKE_",&local_50);
  std::operator+(&local_70,&local_b0,"_LINKER_SUPPORTS_PDB");
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = cmMakefile::IsOn(*(cmMakefile **)((target->ExportMacro)._M_dataplus._M_p + 0x28),&local_70
                          );
  if (bVar1) {
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
    if ((TVar2 < OBJECT_LIBRARY) && (TVar2 != STATIC_LIBRARY)) {
      cmGeneratorTarget::GetPDBDirectory
                (__return_storage_ptr__,(cmGeneratorTarget *)this,(string *)config);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      cmGeneratorTarget::GetPDBName(&local_b0,(cmGeneratorTarget *)this,(string *)config);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_003aa33f;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_b0,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string
              ((string *)&local_90,
               "TARGET_PDB_FILE is allowed only for targets with linker created artifacts.",
               &local_b1);
    reportError((cmGeneratorExpressionContext *)target,&local_b0,&local_90);
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_b0,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string
              ((string *)&local_90,"TARGET_PDB_FILE is not supported by the target linker.",
               &local_b1);
    reportError((cmGeneratorExpressionContext *)target,&local_b0,&local_90);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_003aa33f:
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext *context,
                            const GeneratorExpressionContent *content)
  {
    if (target->IsImported())
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE not allowed for IMPORTED targets.");
      return std::string();
      }

    std::string language = target->GetLinkerLanguage(context->Config);

    std::string pdbSupportVar = "CMAKE_" + language + "_LINKER_SUPPORTS_PDB";

    if(!context->LG->GetMakefile()->IsOn(pdbSupportVar))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is not supported by the target linker.");
      return std::string();
      }

    cmState::TargetType targetType = target->GetType();

    if(targetType != cmState::SHARED_LIBRARY &&
       targetType != cmState::MODULE_LIBRARY &&
       targetType != cmState::EXECUTABLE)
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is allowed only for "
                    "targets with linker created artifacts.");
      return std::string();
      }

    std::string result = target->GetPDBDirectory(context->Config);
    result += "/";
    result += target->GetPDBName(context->Config);
    return result;
  }